

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mpp_enc_impl.cpp
# Opt level: O0

MPP_RET mpp_enc_control_set_ref_cfg(MppEncImpl *enc,void *param)

{
  RK_S32 RVar1;
  MppEncRefCfg local_30;
  MppEncRefCfg dst;
  MppEncRefCfg src;
  void *pvStack_18;
  MPP_RET ret;
  void *param_local;
  MppEncImpl *enc_local;
  
  src._4_4_ = 0;
  local_30 = (enc->cfg).ref_cfg;
  dst = param;
  pvStack_18 = param;
  param_local = enc;
  if (param == (void *)0x0) {
    dst = mpp_enc_ref_default();
  }
  if (local_30 == (MppEncRefCfg)0x0) {
    mpp_enc_ref_cfg_init(&local_30);
    *(MppEncRefCfg *)((long)param_local + 0x1168) = local_30;
  }
  src._4_4_ = mpp_enc_ref_cfg_copy(local_30,dst);
  if (src._4_4_ != MPP_OK) {
    _mpp_log_l(2,"mpp_enc","failed to copy ref cfg ret %d\n","mpp_enc_control_set_ref_cfg",
               (ulong)(uint)src._4_4_);
  }
  src._4_4_ = mpp_enc_refs_set_cfg(*(MppEncRefs *)((long)param_local + 0x210),local_30);
  if (src._4_4_ != MPP_OK) {
    _mpp_log_l(2,"mpp_enc","failed to set ref cfg ret %d\n","mpp_enc_control_set_ref_cfg",
               (ulong)(uint)src._4_4_);
  }
  RVar1 = mpp_enc_refs_update_hdr(*(MppEncRefs *)((long)param_local + 0x210));
  if (RVar1 != 0) {
    *(undefined4 *)((long)param_local + 0x1dc) = 0;
  }
  return src._4_4_;
}

Assistant:

static MPP_RET mpp_enc_control_set_ref_cfg(MppEncImpl *enc, void *param)
{
    MPP_RET ret = MPP_OK;
    MppEncRefCfg src = (MppEncRefCfg)param;
    MppEncRefCfg dst = enc->cfg.ref_cfg;

    if (NULL == src)
        src = mpp_enc_ref_default();

    if (NULL == dst) {
        mpp_enc_ref_cfg_init(&dst);
        enc->cfg.ref_cfg = dst;
    }

    ret = mpp_enc_ref_cfg_copy(dst, src);
    if (ret) {
        mpp_err_f("failed to copy ref cfg ret %d\n", ret);
    }

    ret = mpp_enc_refs_set_cfg(enc->refs, dst);
    if (ret) {
        mpp_err_f("failed to set ref cfg ret %d\n", ret);
    }

    if (mpp_enc_refs_update_hdr(enc->refs))
        enc->hdr_status.val = 0;

    return ret;
}